

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_url_decode(char *src,int src_len,char *dst,int dst_len,int is_form_url_encoded)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ushort *puVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  ushort **ppuVar8;
  __int32_t **pp_Var9;
  int iVar10;
  ulong uVar11;
  
  bVar5 = 0 < src_len;
  uVar11 = 0;
  if (1 < dst_len && 0 < src_len) {
    uVar11 = 0;
    iVar10 = 0;
    do {
      if ((iVar10 < src_len + -2) && (src[iVar10] == '%')) {
        ppuVar8 = __ctype_b_loc();
        puVar4 = *ppuVar8;
        bVar1 = src[(long)iVar10 + 1];
        if (((*(byte *)((long)puVar4 + (ulong)bVar1 * 2 + 1) & 0x10) == 0) ||
           (bVar7 = src[(long)iVar10 + 2],
           (*(byte *)((long)puVar4 + (ulong)bVar7 * 2 + 1) & 0x10) == 0)) goto LAB_0011c387;
        iVar10 = iVar10 + 2;
        pp_Var9 = __ctype_tolower_loc();
        iVar2 = (*pp_Var9)[bVar1];
        iVar3 = (*pp_Var9)[bVar7];
        cVar6 = (char)iVar3;
        bVar7 = cVar6 + 0xa9;
        if ((*(byte *)((long)puVar4 + (long)iVar3 * 2 + 1) & 8) != 0) {
          bVar7 = cVar6 - 0x30;
        }
        bVar7 = bVar7 | (((*(byte *)((long)puVar4 + (long)iVar2 * 2 + 1) & 8) == 0) * '\t' +
                        (char)iVar2) * '\x10';
      }
      else {
LAB_0011c387:
        bVar1 = src[iVar10];
        bVar7 = bVar1;
        if (bVar1 == 0x2b) {
          bVar7 = 0x20;
        }
        if (is_form_url_encoded == 0) {
          bVar7 = bVar1;
        }
      }
      dst[uVar11] = bVar7;
      iVar10 = iVar10 + 1;
      uVar11 = uVar11 + 1;
      bVar5 = iVar10 < src_len;
    } while ((iVar10 < src_len) && (uVar11 < dst_len - 1));
  }
  dst[uVar11 & 0xffffffff] = '\0';
  iVar10 = -1;
  if (!bVar5) {
    iVar10 = (int)uVar11;
  }
  return iVar10;
}

Assistant:

CIVETWEB_API int
mg_url_decode(const char *src,
              int src_len,
              char *dst,
              int dst_len,
              int is_form_url_encoded)
{
	int i, j, a, b;
#define HEXTOI(x) (isdigit(x) ? (x - '0') : (x - 'W'))

	for (i = j = 0; (i < src_len) && (j < (dst_len - 1)); i++, j++) {
		if ((i < src_len - 2) && (src[i] == '%')
		    && isxdigit((unsigned char)src[i + 1])
		    && isxdigit((unsigned char)src[i + 2])) {
			a = tolower((unsigned char)src[i + 1]);
			b = tolower((unsigned char)src[i + 2]);
			dst[j] = (char)((HEXTOI(a) << 4) | HEXTOI(b));
			i += 2;
		} else if (is_form_url_encoded && (src[i] == '+')) {
			dst[j] = ' ';
		} else {
			dst[j] = src[i];
		}
	}

	dst[j] = '\0'; /* Null-terminate the destination */

	return (i >= src_len) ? j : -1;
}